

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O3

void ImGui::ShowFontSelector(char *label)

{
  ImFont *ptr_id;
  bool bVar1;
  ImVec2 in_RAX;
  ImGuiIO *pIVar2;
  ImFont *pIVar3;
  ImFontAtlas *pIVar4;
  long lVar5;
  char *pcVar6;
  ImVec2 local_38;
  
  local_38 = in_RAX;
  pIVar2 = GetIO();
  pIVar3 = GetFont();
  pcVar6 = pIVar3->ConfigData->Name;
  if (pIVar3->ConfigData == (ImFontConfig *)0x0) {
    pcVar6 = "<unknown>";
  }
  bVar1 = BeginCombo(label,pcVar6,0);
  if (bVar1) {
    pIVar4 = pIVar2->Fonts;
    if (0 < (pIVar4->Fonts).Size) {
      lVar5 = 0;
      do {
        ptr_id = (pIVar4->Fonts).Data[lVar5];
        PushID(ptr_id);
        pcVar6 = ptr_id->ConfigData->Name;
        if (ptr_id->ConfigData == (ImFontConfig *)0x0) {
          pcVar6 = "<unknown>";
        }
        local_38.x = 0.0;
        local_38.y = 0.0;
        bVar1 = Selectable(pcVar6,ptr_id == pIVar3,0,&local_38);
        if (bVar1) {
          pIVar2->FontDefault = ptr_id;
        }
        PopID();
        lVar5 = lVar5 + 1;
        pIVar4 = pIVar2->Fonts;
      } while (lVar5 < (pIVar4->Fonts).Size);
    }
    EndCombo();
  }
  SameLine(0.0,-1.0);
  HelpMarker(
            "- Load additional fonts with io.Fonts->AddFontFromFileTTF().\n- The font atlas is built when calling io.Fonts->GetTexDataAsXXXX() or io.Fonts->Build().\n- Read FAQ and docs/FONTS.md for more details.\n- If you need to add/remove fonts at runtime (e.g. for DPI change), do it before calling NewFrame()."
            );
  return;
}

Assistant:

void ImGui::ShowFontSelector(const char* label)
{
    ImGuiIO& io = ImGui::GetIO();
    ImFont* font_current = ImGui::GetFont();
    if (ImGui::BeginCombo(label, font_current->GetDebugName()))
    {
        for (int n = 0; n < io.Fonts->Fonts.Size; n++)
        {
            ImFont* font = io.Fonts->Fonts[n];
            ImGui::PushID((void*)font);
            if (ImGui::Selectable(font->GetDebugName(), font == font_current))
                io.FontDefault = font;
            ImGui::PopID();
        }
        ImGui::EndCombo();
    }
    ImGui::SameLine();
    HelpMarker(
        "- Load additional fonts with io.Fonts->AddFontFromFileTTF().\n"
        "- The font atlas is built when calling io.Fonts->GetTexDataAsXXXX() or io.Fonts->Build().\n"
        "- Read FAQ and docs/FONTS.md for more details.\n"
        "- If you need to add/remove fonts at runtime (e.g. for DPI change), do it before calling NewFrame().");
}